

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

bool __thiscall duckdb::Node::GetNextByte(Node *this,ART *art,uint8_t *byte)

{
  ulong uVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  idx_t iVar3;
  NType NVar4;
  type paVar5;
  iterator iVar6;
  pointer pFVar7;
  data_ptr_t pdVar8;
  InternalException *this_00;
  byte bVar9;
  NType value;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  string local_60;
  string local_40;
  ulong uVar10;
  
  uVar10 = (this->super_IndexPointer).data;
  NVar4 = (NType)(uVar10 >> 0x38);
  value = NVar4 & 0x7f;
  uVar12 = (uint)(uVar10 >> 0x20);
  if (value == NODE_256_LEAF) {
    paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var2._M_head_impl =
         paVar5->_M_elems[8].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    local_60._M_dataplus._M_p = (pointer)(uVar10 & 0xffffffff);
    iVar6 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_60);
    pFVar7 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar6.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    pdVar8 = FixedSizeBuffer::Get(pFVar7,true);
    lVar13 = (ulong)(uVar12 & 0xffffff) * (_Var2._M_head_impl)->segment_size;
    bVar9 = *byte;
    uVar10 = (ulong)bVar9;
    bVar14 = true;
    if ((*(ulong *)(pdVar8 + (ulong)(bVar9 >> 6) * 8 +
                             (_Var2._M_head_impl)->bitmask_offset + lVar13 + 8) >> (uVar10 & 0x3f) &
        1) == 0) {
      uVar11 = uVar10 - 1;
      do {
        if (uVar11 == 0xfe) {
          return false;
        }
        uVar1 = uVar11 + 2;
        uVar11 = uVar11 + 1;
        bVar9 = (char)uVar10 + 1;
        uVar10 = (ulong)bVar9;
      } while ((*(ulong *)(pdVar8 + (uVar1 >> 6) * 8 +
                                    (_Var2._M_head_impl)->bitmask_offset + lVar13 + 8) >>
                (uVar1 & 0x3f) & 1) == 0);
      bVar14 = uVar11 < 0xff;
    }
  }
  else {
    NVar4 = NVar4 & 0x7f;
    if (NVar4 == NODE_15_LEAF) {
      paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var2._M_head_impl =
           paVar5->_M_elems[7].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      local_60._M_dataplus._M_p = (pointer)(uVar10 & 0xffffffff);
      iVar6 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_60);
      pFVar7 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)((long)iVar6.
                                      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                      ._M_cur + 0x10));
      pdVar8 = FixedSizeBuffer::Get(pFVar7,false);
      lVar13 = (ulong)(uVar12 & 0xffffff) * (_Var2._M_head_impl)->segment_size;
      iVar3 = (_Var2._M_head_impl)->bitmask_offset;
      uVar10 = (ulong)pdVar8[iVar3 + lVar13];
      if (uVar10 == 0) {
        return false;
      }
      bVar9 = pdVar8[iVar3 + lVar13 + 1];
      bVar14 = true;
      if (*byte <= bVar9) goto LAB_016e57d2;
      uVar11 = 0;
      do {
        if (uVar10 - 1 == uVar11) {
          return false;
        }
        bVar9 = pdVar8[uVar11 + iVar3 + lVar13 + 2];
        uVar11 = uVar11 + 1;
      } while (bVar9 < *byte);
    }
    else {
      if (NVar4 != NODE_7_LEAF) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Invalid node type for GetNextByte: %s.","");
        EnumUtil::ToString<duckdb::NType>(&local_40,value);
        InternalException::InternalException<std::__cxx11::string>(this_00,&local_60,&local_40);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var2._M_head_impl =
           paVar5->_M_elems[6].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      local_60._M_dataplus._M_p = (pointer)(uVar10 & 0xffffffff);
      iVar6 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_60);
      pFVar7 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)((long)iVar6.
                                      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                      ._M_cur + 0x10));
      pdVar8 = FixedSizeBuffer::Get(pFVar7,false);
      lVar13 = (ulong)(uVar12 & 0xffffff) * (_Var2._M_head_impl)->segment_size;
      iVar3 = (_Var2._M_head_impl)->bitmask_offset;
      uVar10 = (ulong)pdVar8[iVar3 + lVar13];
      if (uVar10 == 0) {
        return false;
      }
      bVar9 = pdVar8[iVar3 + lVar13 + 1];
      bVar14 = true;
      if (*byte <= bVar9) goto LAB_016e57d2;
      uVar11 = 0;
      do {
        if (uVar10 - 1 == uVar11) {
          return false;
        }
        bVar9 = pdVar8[uVar11 + iVar3 + lVar13 + 2];
        uVar11 = uVar11 + 1;
      } while (bVar9 < *byte);
    }
    bVar14 = uVar11 < uVar10;
  }
LAB_016e57d2:
  *byte = bVar9;
  return bVar14;
}

Assistant:

bool Node::GetNextByte(ART &art, uint8_t &byte) const {
	D_ASSERT(HasMetadata());

	auto type = GetType();
	switch (type) {
	case NType::NODE_7_LEAF:
		return Ref<const Node7Leaf>(art, *this, NType::NODE_7_LEAF).GetNextByte(byte);
	case NType::NODE_15_LEAF:
		return Ref<const Node15Leaf>(art, *this, NType::NODE_15_LEAF).GetNextByte(byte);
	case NType::NODE_256_LEAF:
		return Ref<Node256Leaf>(art, *this, NType::NODE_256_LEAF).GetNextByte(byte);
	default:
		throw InternalException("Invalid node type for GetNextByte: %s.", EnumUtil::ToString(type));
	}
}